

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Config config;
  HTTPHandler<Client> http_handler;
  LoggingHandler<Client> logging_handler;
  ExceptionHandler<Client> exception_handler;
  Acceptor<Client> acceptor;
  Server<Client> server;
  Config local_1d4;
  HTTPHandler<Client> local_1c8;
  IHandler<Client> local_190;
  undefined ***local_188;
  undefined8 *local_180;
  undefined **local_178;
  HTTPHandler<Client> *local_170;
  undefined8 *local_168;
  Acceptor<Client> local_160;
  Server<Client> local_140;
  
  local_1d4.threads_number = 2;
  local_1d4.queue_size = 10;
  local_1d4.port = 0x1ed0;
  Acceptor<Client>::Acceptor(&local_160,0x1ed0);
  HTTPHandler<Client>::HTTPHandler(&local_1c8,&RESOLVE_PATH_abi_cxx11_,(ostream *)&std::cerr);
  local_188 = &local_178;
  local_178 = &PTR_handle_0010da88;
  local_168 = &std::cerr;
  local_190._vptr_IHandler = (_func_int **)&PTR_handle_0010dac8;
  local_180 = &std::cerr;
  local_170 = &local_1c8;
  Server<Client>::Server
            (&local_140,&local_190,&local_160.super_IAcceptor<Client>,&local_1d4,
             (ostream *)&std::cerr);
  Server<Client>::start(&local_140);
  ThreadPool<std::packaged_task<void_()>_>::~ThreadPool(&local_140.thread_pool);
  HTTPHandler<Client>::~HTTPHandler(&local_1c8);
  return 0;
}

Assistant:

int main() {
    Server<Client>::Config config(
        THREADS_NUMBER, 
        QUEUE_SIZE,
        PORT
    );

    Acceptor<Client> acceptor(PORT);

    HTTPHandler<Client> http_handler(RESOLVE_PATH, std::cerr);
    ExceptionHandler<Client> exception_handler(http_handler, std::cerr);
    LoggingHandler<Client> logging_handler(exception_handler, std::cerr);

    Server<Client> server(logging_handler, acceptor, config, std::cerr);

    server.start();
}